

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_structs.c
# Opt level: O0

ulp_ring_public_key * ulp_ring_alloc_public_key(size_t n)

{
  uint64_t *puVar1;
  size_t in_RDI;
  ulp_ring_public_key *key;
  ulp_ring_public_key *local_8;
  
  local_8 = (ulp_ring_public_key *)malloc(0x28);
  if (local_8 == (ulp_ring_public_key *)0x0) {
    local_8 = (ulp_ring_public_key *)0x0;
  }
  else {
    local_8->n = in_RDI;
    puVar1 = (uint64_t *)malloc(in_RDI << 3);
    local_8->a = puVar1;
    puVar1 = (uint64_t *)malloc(in_RDI << 3);
    local_8->p = puVar1;
    if ((local_8->a == (uint64_t *)0x0) || (local_8->p == (uint64_t *)0x0)) {
      free(local_8->a);
      free(local_8->p);
      free(local_8);
      local_8 = (ulp_ring_public_key *)0x0;
    }
  }
  return local_8;
}

Assistant:

ulp_ring_public_key* ulp_ring_alloc_public_key(size_t n) {
    ulp_ring_public_key* key = malloc(sizeof(ulp_ring_public_key));
    if(key == NULL)
        return NULL;
    key->n = n;
    key->a = malloc(n*sizeof(key->q));
    key->p = malloc(n*sizeof(key->q));
    if(key->a == NULL || key->p == NULL) {
        free(key->a);
        free(key->p);
        free(key);
        return NULL;
    }
    return key;
}